

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

void printMapping(UCMapping *m,UChar32 *codePoints,uint8_t *bytes,FILE *f)

{
  int local_2c;
  int32_t j;
  FILE *f_local;
  uint8_t *bytes_local;
  UChar32 *codePoints_local;
  UCMapping *m_local;
  
  for (local_2c = 0; local_2c < m->uLen; local_2c = local_2c + 1) {
    fprintf((FILE *)f,"<U%04lX>",(long)codePoints[local_2c]);
  }
  fputc(0x20,(FILE *)f);
  for (local_2c = 0; local_2c < m->bLen; local_2c = local_2c + 1) {
    fprintf((FILE *)f,"\\x%02X",(ulong)bytes[local_2c]);
  }
  if (m->f < '\0') {
    fputs("\n",(FILE *)f);
  }
  else {
    fprintf((FILE *)f," |%u\n",(ulong)(uint)(int)m->f);
  }
  return;
}

Assistant:

static void
printMapping(UCMapping *m, UChar32 *codePoints, uint8_t *bytes, FILE *f) {
    int32_t j;

    for(j=0; j<m->uLen; ++j) {
        fprintf(f, "<U%04lX>", (long)codePoints[j]);
    }

    fputc(' ', f);

    for(j=0; j<m->bLen; ++j) {
        fprintf(f, "\\x%02X", bytes[j]);
    }

    if(m->f>=0) {
        fprintf(f, " |%u\n", m->f);
    } else {
        fputs("\n", f);
    }
}